

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_0::verifyUniformValue1i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[1]> state;
  undefined1 local_1a8 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[1]>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[1]>::verifyValidity
                    (&state,testCtx);
  if ((bVar1) && (state.m_value[0] != 1)) {
    local_1a8._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: expected [");
    std::ostream::operator<<(this,1);
    std::operator<<((ostream *)this,"]; got [");
    std::ostream::operator<<(this,state.m_value[0]);
    std::operator<<((ostream *)this,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue1i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[1]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x
		<< "]; got ["
		<< state[0]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}